

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<ReadThreadsGraph*,std::vector<long,std::allocator<long>>,long>::
load_impl_sequence<0ul,1ul,2ul>(void *param_1,long param_2)

{
  reference pvVar1;
  initializer_list<bool> *this;
  const_iterator pbVar2;
  reference rVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  handle in_stack_00000038;
  initializer_list<bool> *__range3;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 convert;
  handle in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  const_iterator local_88;
  reference local_80;
  PyObject *local_70;
  unkbyte9 Var4;
  handle src;
  reference local_50;
  PyObject *local_40;
  bool local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  convert = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>,pybind11::detail::type_caster<long,void>>
            ((tuple<pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>,_pybind11::detail::type_caster<long,_void>_>
              *)0x3eafb9);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff70,
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_33 = type_caster_generic::load
                       ((type_caster_generic *)param_1,in_stack_ffffffffffffff60,(bool)convert);
  this = (initializer_list<bool> *)
         std::
         get<1ul,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>,pybind11::detail::type_caster<long,void>>
                   ((tuple<pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>,_pybind11::detail::type_caster<long,_void>_>
                     *)0x3eb02a);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  src.m_ptr = pvVar1->m_ptr;
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffff70,
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  Var4 = rVar3._7_9_;
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff98);
  local_32 = list_caster<std::vector<long,_std::allocator<long>_>,_long>::load
                       ((list_caster<std::vector<long,_std::allocator<long>_>,_long> *)__begin0,
                        in_stack_00000038,__end0._7_1_);
  std::
  get<2ul,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>,pybind11::detail::type_caster<long,void>>
            ((tuple<pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>,_pybind11::detail::type_caster<long,_void>_>
              *)0x3eb09f);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      2);
  local_70 = pvVar1->m_ptr;
  local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff70,
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator_cast_to_bool(&local_80);
  local_31 = type_caster<long,_void>::load(SUB98(Var4,1),src,SUB91(Var4,0));
  local_30._M_array = &local_33;
  local_30._M_len = 3;
  local_20 = &local_30;
  local_88 = std::initializer_list<bool>::begin(local_20);
  pbVar2 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (local_88 == pbVar2) {
      return true;
    }
    if ((*local_88 & 1U) == 0) break;
    local_88 = local_88 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }